

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void cjson_set_valuestring_to_object_should_not_leak_memory(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *pcVar2;
  char *pcVar3;
  char *pcVar4;
  cJSON_bool in_R8D;
  
  object = cJSON_ParseWithLengthOpts("{}",3,(char **)0x0,0);
  pcVar1 = cJSON_CreateString("valuestring could be changed safely");
  pcVar2 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar2 != (cJSON *)0x0) {
    pcVar2->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar2->type = 0;
    pcVar2->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar2->valueint = 0;
    pcVar2->valuedouble = 0.0;
    pcVar2->string = (char *)0x0;
    pcVar2->next = (cJSON *)0x0;
    pcVar2->prev = (cJSON *)0x0;
    pcVar2->type = 0x110;
    pcVar2->valuestring = "reference item should be freed by yourself";
  }
  add_item_to_object(object,"one",pcVar1,(internal_hooks *)0x0,in_R8D);
  add_item_to_object(object,"two",pcVar2,(internal_hooks *)0x0,in_R8D);
  pcVar4 = pcVar1->valuestring;
  pcVar2 = get_object_item(object,"one",0);
  pcVar3 = cJSON_SetValuestring(pcVar2,"shorter valuestring");
  if (pcVar3 == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x2c5);
  }
  UnityAssertEqualNumber
            ((UNITY_INT)pcVar4,(UNITY_INT)pcVar3,
             "new valuestring shorter than old should not reallocate memory",0x2c6,
             UNITY_DISPLAY_STYLE_HEX64);
  pcVar2 = get_object_item(object,"one",0);
  UnityAssertEqualString("shorter valuestring",pcVar2->valuestring,(char *)0x0,0x2c7);
  pcVar4 = pcVar1->valuestring;
  pcVar1 = get_object_item(object,"one",0);
  pcVar3 = cJSON_SetValuestring
                     (pcVar1,
                      "new valuestring which much longer than previous should be changed safely");
  if (pcVar3 == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x2cc);
  }
  if (pcVar4 == pcVar3) {
    UnityFail("new valuestring longer than old should reallocate memory",0x2cd);
  }
  pcVar1 = get_object_item(object,"one",0);
  UnityAssertEqualString
            ("new valuestring which much longer than previous should be changed safely",
             pcVar1->valuestring,(char *)0x0,0x2ce);
  pcVar1 = get_object_item(object,"two",0);
  pcVar4 = cJSON_SetValuestring
                     (pcVar1,
                      "new valuestring which much longer than previous should be changed safely");
  if (pcVar4 != (char *)0x0) {
    UnityFail("valuestring of reference object should not be changed",0x2d1);
  }
  pcVar1 = get_object_item(object,"two",0);
  UnityAssertEqualString
            ("reference item should be freed by yourself",pcVar1->valuestring,(char *)0x0,0x2d2);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_set_valuestring_to_object_should_not_leak_memory(void)
{
    cJSON *root = cJSON_Parse("{}");
    const char *stringvalue = "valuestring could be changed safely";
    const char *reference_valuestring = "reference item should be freed by yourself";
    const char *short_valuestring = "shorter valuestring";
    const char *long_valuestring = "new valuestring which much longer than previous should be changed safely";
    cJSON *item1 = cJSON_CreateString(stringvalue);
    cJSON *item2 = cJSON_CreateStringReference(reference_valuestring);
    char *ptr1 = NULL;
    char *return_value = NULL;

    cJSON_AddItemToObject(root, "one", item1);
    cJSON_AddItemToObject(root, "two", item2);

    ptr1 = item1->valuestring;
    return_value = cJSON_SetValuestring(cJSON_GetObjectItem(root, "one"), short_valuestring);
    TEST_ASSERT_NOT_NULL(return_value);
    TEST_ASSERT_EQUAL_PTR_MESSAGE(ptr1, return_value, "new valuestring shorter than old should not reallocate memory");
    TEST_ASSERT_EQUAL_STRING(short_valuestring, cJSON_GetObjectItem(root, "one")->valuestring);

    /* we needn't to free the original valuestring manually */
    ptr1 = item1->valuestring;
    return_value = cJSON_SetValuestring(cJSON_GetObjectItem(root, "one"), long_valuestring);
    TEST_ASSERT_NOT_NULL(return_value);
    TEST_ASSERT_NOT_EQUAL_MESSAGE(ptr1, return_value, "new valuestring longer than old should reallocate memory")
    TEST_ASSERT_EQUAL_STRING(long_valuestring, cJSON_GetObjectItem(root, "one")->valuestring);

    return_value = cJSON_SetValuestring(cJSON_GetObjectItem(root, "two"), long_valuestring);
    TEST_ASSERT_NULL_MESSAGE(return_value, "valuestring of reference object should not be changed");
    TEST_ASSERT_EQUAL_STRING(reference_valuestring, cJSON_GetObjectItem(root, "two")->valuestring);

    cJSON_Delete(root);
}